

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O3

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Latin1,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::EncodingEmitter_u>
          (Utf8Dfa *this,EncodingEmitter_u *emitter,utf8_t *p)

{
  uint_t uVar1;
  byte *pbVar2;
  byte bVar3;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    pbVar2 = (byte *)emitter->m_p;
    bVar3 = (byte)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xc0;
    break;
  case 2:
  case 3:
    pbVar2 = (byte *)emitter->m_p;
    bVar3 = (byte)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xe0;
    break;
  case 4:
    pbVar2 = (byte *)emitter->m_p;
    bVar3 = (byte)((uint)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6) |
            0xe0;
    goto LAB_00145871;
  default:
    goto switchD_0014582f_caseD_5;
  case 6:
  case 7:
    pbVar2 = (byte *)emitter->m_p;
    bVar3 = (byte)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xf0;
    break;
  case 8:
    pbVar2 = (byte *)emitter->m_p;
    bVar3 = (byte)((uint)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6) |
            0xf0;
LAB_00145871:
    *pbVar2 = bVar3;
    pbVar2[1] = (byte)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3f |
                0x80;
    pbVar2 = pbVar2 + 2;
    goto LAB_001458b2;
  case 10:
    pbVar2 = (byte *)emitter->m_p;
    *pbVar2 = (byte)((uint)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 0xc)
              | 0xf0;
    pbVar2[1] = (byte)((uint)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6)
                & 0x3f | 0x80;
    pbVar2[2] = (byte)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3f |
                0x80;
    pbVar2 = pbVar2 + 3;
    goto LAB_001458b2;
  }
  *pbVar2 = bVar3;
  pbVar2 = pbVar2 + 1;
LAB_001458b2:
  emitter->m_p = (DstUnit *)pbVar2;
switchD_0014582f_caseD_5:
  return;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}